

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen8CachePolicy.cpp
# Opt level: O0

GMM_STATUS __thiscall GmmLib::GmmGen8CachePolicy::InitCachePolicy(GmmGen8CachePolicy *this)

{
  GMM_CACHE_POLICY_ELEMENT *pGVar1;
  GMM_CACHE_POLICY_ELEMENT CachePolicyUsage;
  SKU_FEATURE_TABLE *pSVar2;
  GT_SYSTEM_INFO *pGVar3;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  uint64_t local_28;
  uint64_t PTEValue;
  bool CachePolicyError;
  GmmGen8CachePolicy *pGStack_18;
  uint32_t Usage;
  GmmGen8CachePolicy *this_local;
  
  if ((this->super_GmmCachePolicyCommon).pCachePolicy == (GMM_CACHE_POLICY_ELEMENT *)0x0) {
    this_local._4_4_ = GMM_ERROR;
  }
  else {
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffffffffff7 | 8;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffefffffffffffff;
    pGStack_18 = this;
    pSVar2 = Context::GetSkuTable((this->super_GmmCachePolicyCommon).pGmmLibContext);
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x12].field_1.Value =
         pGVar1[0x12].field_1.Value & 0xfffffffffffffffe | (ulong)(((uint)pSVar2->field_0 & 1) == 0)
    ;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffefffffffffffff;
    pGVar3 = Context::GetGtSysInfo((this->super_GmmCachePolicyCommon).pGmmLibContext);
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1f].field_1.Value =
         pGVar1[0x1f].field_1.Value & 0xfffffffffffffffe | (ulong)(pGVar3->EdramSizeInKb == 0);
    pGVar3 = Context::GetGtSysInfo((this->super_GmmCachePolicyCommon).pGmmLibContext);
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1f].field_1.Value =
         pGVar1[0x1f].field_1.Value & 0xfffffffffffffffd | (ulong)(pGVar3->EdramSizeInKb != 0) << 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffffffffffffffe;
    pGVar3 = Context::GetGtSysInfo((this->super_GmmCachePolicyCommon).pGmmLibContext);
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x20].field_1.Value =
         pGVar1[0x20].field_1.Value & 0xfffffffffffffffd | (ulong)(pGVar3->EdramSizeInKb != 0) << 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffffffffffffffb;
    pGVar3 = Context::GetGtSysInfo((this->super_GmmCachePolicyCommon).pGmmLibContext);
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x20].field_1.Value =
         pGVar1[0x20].field_1.Value & 0xfffffffffffffff7 | (ulong)(pGVar3->EdramSizeInKb != 0) << 3;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffffffffffe;
    pGVar3 = Context::GetGtSysInfo((this->super_GmmCachePolicyCommon).pGmmLibContext);
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x22].field_1.Value =
         pGVar1[0x22].field_1.Value & 0xfffffffffffffffd | (ulong)(pGVar3->EdramSizeInKb != 0) << 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffefffffffffffff;
    pGVar3 = Context::GetGtSysInfo((this->super_GmmCachePolicyCommon).pGmmLibContext);
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2c].field_1.Value =
         pGVar1[0x2c].field_1.Value & 0xfffffffffffffffe | (ulong)(pGVar3->EdramSizeInKb == 0);
    pGVar3 = Context::GetGtSysInfo((this->super_GmmCachePolicyCommon).pGmmLibContext);
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2c].field_1.Value =
         pGVar1[0x2c].field_1.Value & 0xfffffffffffffffd | (ulong)(pGVar3->EdramSizeInKb != 0) << 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffffffffffe;
    pGVar3 = Context::GetGtSysInfo((this->super_GmmCachePolicyCommon).pGmmLibContext);
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2f].field_1.Value =
         pGVar1[0x2f].field_1.Value & 0xfffffffffffffffd | (ulong)(pGVar3->EdramSizeInKb != 0) << 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffffffffffe;
    pGVar3 = Context::GetGtSysInfo((this->super_GmmCachePolicyCommon).pGmmLibContext);
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x30].field_1.Value =
         pGVar1[0x30].field_1.Value & 0xfffffffffffffffd | (ulong)(pGVar3->EdramSizeInKb != 0) << 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffffffffffe;
    pGVar3 = Context::GetGtSysInfo((this->super_GmmCachePolicyCommon).pGmmLibContext);
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x32].field_1.Value =
         pGVar1[0x32].field_1.Value & 0xfffffffffffffffd | (ulong)(pGVar3->EdramSizeInKb != 0) << 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffffffffffe;
    pGVar3 = Context::GetGtSysInfo((this->super_GmmCachePolicyCommon).pGmmLibContext);
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x35].field_1.Value =
         pGVar1[0x35].field_1.Value & 0xfffffffffffffffd | (ulong)(pGVar3->EdramSizeInKb != 0) << 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffffffffffe;
    pGVar3 = Context::GetGtSysInfo((this->super_GmmCachePolicyCommon).pGmmLibContext);
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x36].field_1.Value =
         pGVar1[0x36].field_1.Value & 0xfffffffffffffffd | (ulong)(pGVar3->EdramSizeInKb != 0) << 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffffffffffe;
    pGVar3 = Context::GetGtSysInfo((this->super_GmmCachePolicyCommon).pGmmLibContext);
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x37].field_1.Value =
         pGVar1[0x37].field_1.Value & 0xfffffffffffffffd | (ulong)(pGVar3->EdramSizeInKb != 0) << 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffffffffffe;
    pGVar3 = Context::GetGtSysInfo((this->super_GmmCachePolicyCommon).pGmmLibContext);
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x38].field_1.Value =
         pGVar1[0x38].field_1.Value & 0xfffffffffffffffd | (ulong)(pGVar3->EdramSizeInKb != 0) << 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffefffffffffffff;
    pGVar3 = Context::GetGtSysInfo((this->super_GmmCachePolicyCommon).pGmmLibContext);
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x41].field_1.Value =
         pGVar1[0x41].field_1.Value & 0xfffffffffffffffe | (ulong)(pGVar3->EdramSizeInKb == 0);
    pGVar3 = Context::GetGtSysInfo((this->super_GmmCachePolicyCommon).pGmmLibContext);
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x41].field_1.Value =
         pGVar1[0x41].field_1.Value & 0xfffffffffffffffd | (ulong)(pGVar3->EdramSizeInKb != 0) << 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffffffffffe;
    pGVar3 = Context::GetGtSysInfo((this->super_GmmCachePolicyCommon).pGmmLibContext);
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x43].field_1.Value =
         pGVar1[0x43].field_1.Value & 0xfffffffffffffffd | (ulong)(pGVar3->EdramSizeInKb != 0) << 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffffffffffe;
    pGVar3 = Context::GetGtSysInfo((this->super_GmmCachePolicyCommon).pGmmLibContext);
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x48].field_1.Value =
         pGVar1[0x48].field_1.Value & 0xfffffffffffffffd | (ulong)(pGVar3->EdramSizeInKb != 0) << 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffffffffffe;
    pGVar3 = Context::GetGtSysInfo((this->super_GmmCachePolicyCommon).pGmmLibContext);
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4b].field_1.Value =
         pGVar1[0x4b].field_1.Value & 0xfffffffffffffffd | (ulong)(pGVar3->EdramSizeInKb != 0) << 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffffffffffe;
    pGVar3 = Context::GetGtSysInfo((this->super_GmmCachePolicyCommon).pGmmLibContext);
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x50].field_1.Value =
         pGVar1[0x50].field_1.Value & 0xfffffffffffffffd | (ulong)(pGVar3->EdramSizeInKb != 0) << 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffffffffffe;
    pGVar3 = Context::GetGtSysInfo((this->super_GmmCachePolicyCommon).pGmmLibContext);
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x51].field_1.Value =
         pGVar1[0x51].field_1.Value & 0xfffffffffffffffd | (ulong)(pGVar3->EdramSizeInKb != 0) << 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x68].field_1.Value = pGVar1[0x68].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x68].field_1.Value = pGVar1[0x68].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x68].field_1.Value = pGVar1[0x68].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x68].field_1.Value = pGVar1[0x68].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x68].field_1.Value = pGVar1[0x68].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x68].field_1.Value = pGVar1[0x68].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x68].field_1.Value = pGVar1[0x68].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x68].field_1.Value = pGVar1[0x68].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x68].field_1.Value = pGVar1[0x68].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x68].field_1.Value = pGVar1[0x68].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x68].field_1.Value = pGVar1[0x68].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x68].field_1.Value = pGVar1[0x68].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x68].field_1.Value = pGVar1[0x68].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x68].field_1.Value = pGVar1[0x68].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x68].field_1.Value = pGVar1[0x68].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x68].field_1.Value = pGVar1[0x68].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x68].field_1.Value = pGVar1[0x68].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x68].field_1.Value = pGVar1[0x68].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x68].field_1.Value = pGVar1[0x68].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x68].field_1.Value = pGVar1[0x68].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x68].field_1.Value = pGVar1[0x68].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x68].field_1.Value = pGVar1[0x68].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x68].field_1.Value = pGVar1[0x68].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x68].field_1.Value = pGVar1[0x68].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x69].field_1.Value = pGVar1[0x69].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x69].field_1.Value = pGVar1[0x69].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x69].field_1.Value = pGVar1[0x69].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x69].field_1.Value = pGVar1[0x69].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x69].field_1.Value = pGVar1[0x69].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x69].field_1.Value = pGVar1[0x69].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x69].field_1.Value = pGVar1[0x69].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x69].field_1.Value = pGVar1[0x69].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x69].field_1.Value = pGVar1[0x69].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x69].field_1.Value = pGVar1[0x69].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x69].field_1.Value = pGVar1[0x69].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x69].field_1.Value = pGVar1[0x69].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x69].field_1.Value = pGVar1[0x69].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x69].field_1.Value = pGVar1[0x69].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x69].field_1.Value = pGVar1[0x69].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x69].field_1.Value = pGVar1[0x69].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x69].field_1.Value = pGVar1[0x69].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x69].field_1.Value = pGVar1[0x69].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x69].field_1.Value = pGVar1[0x69].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x69].field_1.Value = pGVar1[0x69].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x69].field_1.Value = pGVar1[0x69].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x69].field_1.Value = pGVar1[0x69].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x69].field_1.Value = pGVar1[0x69].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x69].field_1.Value = pGVar1[0x69].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x92].field_1.Value = pGVar1[0x92].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x92].field_1.Value = pGVar1[0x92].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x92].field_1.Value = pGVar1[0x92].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x92].field_1.Value = pGVar1[0x92].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x92].field_1.Value = pGVar1[0x92].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x92].field_1.Value = pGVar1[0x92].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x92].field_1.Value = pGVar1[0x92].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x92].field_1.Value = pGVar1[0x92].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x92].field_1.Value = pGVar1[0x92].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x92].field_1.Value = pGVar1[0x92].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x92].field_1.Value = pGVar1[0x92].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x92].field_1.Value = pGVar1[0x92].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x92].field_1.Value = pGVar1[0x92].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x92].field_1.Value = pGVar1[0x92].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x92].field_1.Value = pGVar1[0x92].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x92].field_1.Value = pGVar1[0x92].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x92].field_1.Value = pGVar1[0x92].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x92].field_1.Value = pGVar1[0x92].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x92].field_1.Value = pGVar1[0x92].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x92].field_1.Value = pGVar1[0x92].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x92].field_1.Value = pGVar1[0x92].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x92].field_1.Value = pGVar1[0x92].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x92].field_1.Value = pGVar1[0x92].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x92].field_1.Value = pGVar1[0x92].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x93].field_1.Value = pGVar1[0x93].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x93].field_1.Value = pGVar1[0x93].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x93].field_1.Value = pGVar1[0x93].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x93].field_1.Value = pGVar1[0x93].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x93].field_1.Value = pGVar1[0x93].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x93].field_1.Value = pGVar1[0x93].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x93].field_1.Value = pGVar1[0x93].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x93].field_1.Value = pGVar1[0x93].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x93].field_1.Value = pGVar1[0x93].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x93].field_1.Value = pGVar1[0x93].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x93].field_1.Value = pGVar1[0x93].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x93].field_1.Value = pGVar1[0x93].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x93].field_1.Value = pGVar1[0x93].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x93].field_1.Value = pGVar1[0x93].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x93].field_1.Value = pGVar1[0x93].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x93].field_1.Value = pGVar1[0x93].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x93].field_1.Value = pGVar1[0x93].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x93].field_1.Value = pGVar1[0x93].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x93].field_1.Value = pGVar1[0x93].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x93].field_1.Value = pGVar1[0x93].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x93].field_1.Value = pGVar1[0x93].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x93].field_1.Value = pGVar1[0x93].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x93].field_1.Value = pGVar1[0x93].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x93].field_1.Value = pGVar1[0x93].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x94].field_1.Value = pGVar1[0x94].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x94].field_1.Value = pGVar1[0x94].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x94].field_1.Value = pGVar1[0x94].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x94].field_1.Value = pGVar1[0x94].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x94].field_1.Value = pGVar1[0x94].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x94].field_1.Value = pGVar1[0x94].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x94].field_1.Value = pGVar1[0x94].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x94].field_1.Value = pGVar1[0x94].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x94].field_1.Value = pGVar1[0x94].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x94].field_1.Value = pGVar1[0x94].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x94].field_1.Value = pGVar1[0x94].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x94].field_1.Value = pGVar1[0x94].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x94].field_1.Value = pGVar1[0x94].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x94].field_1.Value = pGVar1[0x94].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x94].field_1.Value = pGVar1[0x94].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x94].field_1.Value = pGVar1[0x94].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x94].field_1.Value = pGVar1[0x94].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x94].field_1.Value = pGVar1[0x94].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x94].field_1.Value = pGVar1[0x94].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x94].field_1.Value = pGVar1[0x94].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x94].field_1.Value = pGVar1[0x94].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x94].field_1.Value = pGVar1[0x94].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x94].field_1.Value = pGVar1[0x94].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x94].field_1.Value = pGVar1[0x94].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x95].field_1.Value = pGVar1[0x95].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x95].field_1.Value = pGVar1[0x95].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x95].field_1.Value = pGVar1[0x95].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x95].field_1.Value = pGVar1[0x95].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x95].field_1.Value = pGVar1[0x95].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x95].field_1.Value = pGVar1[0x95].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x95].field_1.Value = pGVar1[0x95].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x95].field_1.Value = pGVar1[0x95].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x95].field_1.Value = pGVar1[0x95].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x95].field_1.Value = pGVar1[0x95].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x95].field_1.Value = pGVar1[0x95].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x95].field_1.Value = pGVar1[0x95].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x95].field_1.Value = pGVar1[0x95].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x95].field_1.Value = pGVar1[0x95].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x95].field_1.Value = pGVar1[0x95].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x95].field_1.Value = pGVar1[0x95].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x95].field_1.Value = pGVar1[0x95].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x95].field_1.Value = pGVar1[0x95].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x95].field_1.Value = pGVar1[0x95].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x95].field_1.Value = pGVar1[0x95].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x95].field_1.Value = pGVar1[0x95].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x95].field_1.Value = pGVar1[0x95].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x95].field_1.Value = pGVar1[0x95].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x95].field_1.Value = pGVar1[0x95].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x96].field_1.Value = pGVar1[0x96].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x96].field_1.Value = pGVar1[0x96].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x96].field_1.Value = pGVar1[0x96].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x96].field_1.Value = pGVar1[0x96].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x96].field_1.Value = pGVar1[0x96].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x96].field_1.Value = pGVar1[0x96].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x96].field_1.Value = pGVar1[0x96].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x96].field_1.Value = pGVar1[0x96].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x96].field_1.Value = pGVar1[0x96].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x96].field_1.Value = pGVar1[0x96].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x96].field_1.Value = pGVar1[0x96].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x96].field_1.Value = pGVar1[0x96].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x96].field_1.Value = pGVar1[0x96].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x96].field_1.Value = pGVar1[0x96].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x96].field_1.Value = pGVar1[0x96].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x96].field_1.Value = pGVar1[0x96].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x96].field_1.Value = pGVar1[0x96].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x96].field_1.Value = pGVar1[0x96].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x96].field_1.Value = pGVar1[0x96].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x96].field_1.Value = pGVar1[0x96].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x96].field_1.Value = pGVar1[0x96].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x96].field_1.Value = pGVar1[0x96].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x96].field_1.Value = pGVar1[0x96].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x96].field_1.Value = pGVar1[0x96].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xa3].field_1.Value = pGVar1[0xa3].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xec].field_1.Value = pGVar1[0xec].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffefffffffffffff;
    pSVar2 = Context::GetSkuTable((this->super_GmmCachePolicyCommon).pGmmLibContext);
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf3].field_1.Value =
         pGVar1[0xf3].field_1.Value & 0xfffffffffffffffe |
         (ulong)(((ulong)pSVar2->field_1 >> 0x16 & 1) != 0);
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xfffffffffffffff7;
    pSVar2 = Context::GetSkuTable((this->super_GmmCachePolicyCommon).pGmmLibContext);
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf3].field_1.Value =
         pGVar1[0xf3].field_1.Value & 0xffffffffffffffcf |
         (ulong)(((ulong)pSVar2->field_1 >> 0x16 & 1) != 0) << 4;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffefffffffffffff;
    for (PTEValue._4_4_ = 0; PTEValue._4_4_ < 0x11e; PTEValue._4_4_ = PTEValue._4_4_ + 1) {
      PTEValue._3_1_ = 0;
      local_28 = 0;
      if (((((this->super_GmmCachePolicyCommon).pCachePolicy[PTEValue._4_4_].field_1.Value & 1) == 0
           ) || (((this->super_GmmCachePolicyCommon).pCachePolicy[PTEValue._4_4_].field_1.Value >> 1
                 & 1) == 0)) ||
         (((this->super_GmmCachePolicyCommon).pCachePolicy[PTEValue._4_4_].field_1.Value >> 2 & 1)
          == 0)) {
        if ((((this->super_GmmCachePolicyCommon).pCachePolicy[PTEValue._4_4_].field_1.Value & 1) ==
             0) || (((this->super_GmmCachePolicyCommon).pCachePolicy[PTEValue._4_4_].field_1.Value
                     >> 1 & 1) == 0)) {
          if (((this->super_GmmCachePolicyCommon).pCachePolicy[PTEValue._4_4_].field_1.Value >> 1 &
              1) == 0) {
            if (((this->super_GmmCachePolicyCommon).pCachePolicy[PTEValue._4_4_].field_1.Value & 1)
                != 0) {
              pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
              pGVar1[PTEValue._4_4_].MemoryObjectOverride.DwordValue =
                   pGVar1[PTEValue._4_4_].MemoryObjectOverride.DwordValue & 0xffffffe7 | 8;
            }
          }
          else {
            pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
            pGVar1[PTEValue._4_4_].MemoryObjectOverride.DwordValue =
                 pGVar1[PTEValue._4_4_].MemoryObjectOverride.DwordValue & 0xffffffe7;
          }
        }
        else {
          pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
          pGVar1[PTEValue._4_4_].MemoryObjectOverride.DwordValue =
               pGVar1[PTEValue._4_4_].MemoryObjectOverride.DwordValue & 0xffffffe7 | 0x10;
        }
      }
      else {
        pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
        pGVar1[PTEValue._4_4_].MemoryObjectOverride.DwordValue =
             pGVar1[PTEValue._4_4_].MemoryObjectOverride.DwordValue & 0xffffffe7 | 0x18;
      }
      pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
      pGVar1[PTEValue._4_4_].MemoryObjectOverride.DwordValue =
           pGVar1[PTEValue._4_4_].MemoryObjectOverride.DwordValue & 0xfffffffc |
           (uint)((this->super_GmmCachePolicyCommon).pCachePolicy[PTEValue._4_4_].field_1.Value >> 4
                 ) & 3;
      if (((this->super_GmmCachePolicyCommon).pCachePolicy[PTEValue._4_4_].field_1.Value >> 3 & 1)
          == 0) {
        if ((((this->super_GmmCachePolicyCommon).pCachePolicy[PTEValue._4_4_].field_1.Value & 1) ==
             0) && (((this->super_GmmCachePolicyCommon).pCachePolicy[PTEValue._4_4_].field_1.Value
                     >> 1 & 1) == 0)) {
          pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
          pGVar1[PTEValue._4_4_].MemoryObjectOverride.DwordValue =
               pGVar1[PTEValue._4_4_].MemoryObjectOverride.DwordValue & 0xffffff9f | 0x20;
        }
        else {
          pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
          pGVar1[PTEValue._4_4_].MemoryObjectOverride.DwordValue =
               pGVar1[PTEValue._4_4_].MemoryObjectOverride.DwordValue & 0xffffff9f | 0x60;
        }
      }
      else {
        pGVar1 = (this->super_GmmCachePolicyCommon).pCachePolicy;
        pGVar1[PTEValue._4_4_].MemoryObjectOverride.DwordValue =
             pGVar1[PTEValue._4_4_].MemoryObjectOverride.DwordValue & 0xffffff9f | 0x40;
      }
      memcpy(&local_50,(this->super_GmmCachePolicyCommon).pCachePolicy + PTEValue._4_4_,0x28);
      CachePolicyUsage.field_1 =
           (anon_union_8_2_649915e9_for_GMM_CACHE_POLICY_ELEMENT_REC_1)uStack_48;
      CachePolicyUsage._0_8_ = local_50;
      CachePolicyUsage.MemoryObjectOverride = (MEMORY_OBJECT_CONTROL_STATE)(undefined4)local_40;
      CachePolicyUsage.field_3 =
           (anon_union_4_2_78ef2503_for_GMM_CACHE_POLICY_ELEMENT_REC_4)local_40._4_4_;
      CachePolicyUsage.PTE = (GMM_PTE_CACHE_CONTROL_BITS)uStack_38;
      CachePolicyUsage.Override = (undefined4)local_30;
      CachePolicyUsage.IsOverridenByRegkey = local_30._4_4_;
      GetUsagePTEValue(this,CachePolicyUsage,PTEValue._4_4_,&local_28);
      (this->super_GmmCachePolicyCommon).pCachePolicy[PTEValue._4_4_].PTE.field_4.DwordValue =
           (uint32_t)local_28;
      (this->super_GmmCachePolicyCommon).pCachePolicy[PTEValue._4_4_].PTE.field_4.HighDwordValue = 0
      ;
      (this->super_GmmCachePolicyCommon).pCachePolicy[PTEValue._4_4_].Override = 0xffffffff;
    }
    this_local._4_4_ = GMM_SUCCESS;
  }
  return this_local._4_4_;
}

Assistant:

GMM_STATUS GmmLib::GmmGen8CachePolicy::InitCachePolicy()
{

    __GMM_ASSERTPTR(pCachePolicy, GMM_ERROR);

#define DEFINE_CACHE_ELEMENT(usage, llc, ellc, l3, wt, age) DEFINE_CP_ELEMENT(usage, llc, ellc, l3, wt, age, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0)
#include "GmmGen8CachePolicy.h"

    {
// Gen8 Memory Object Definitions
#define MO_ELLC 0x0
#define MO_LLC 0x1
#define MO_LLC_ELLC 0x2
#define MO_L3_LLC_ELLC 0x3

#define MO_USE_PTE 0x0
#define MO_UC 0x1
#define MO_WT 0x2
#define MO_WB 0x3

        // Define index of cache element
        uint32_t Usage = 0;

        // Process Cache Policy and fill in look up table
        for(; Usage < GMM_RESOURCE_USAGE_MAX; Usage++)
        {
            bool     CachePolicyError = false;
            uint64_t PTEValue         = 0;

            if(pCachePolicy[Usage].LLC && pCachePolicy[Usage].ELLC && pCachePolicy[Usage].L3)
                pCachePolicy[Usage].MemoryObjectOverride.Gen8.TargetCache = MO_L3_LLC_ELLC;
            else if(pCachePolicy[Usage].LLC && pCachePolicy[Usage].ELLC)
                pCachePolicy[Usage].MemoryObjectOverride.Gen8.TargetCache = MO_LLC_ELLC;
            else if(pCachePolicy[Usage].ELLC)
                pCachePolicy[Usage].MemoryObjectOverride.Gen8.TargetCache = MO_ELLC;
            else if(pCachePolicy[Usage].LLC)
                pCachePolicy[Usage].MemoryObjectOverride.Gen8.TargetCache = MO_LLC;

            pCachePolicy[Usage].MemoryObjectOverride.Gen8.Age = pCachePolicy[Usage].AGE;

            if(pCachePolicy[Usage].WT)
                pCachePolicy[Usage].MemoryObjectOverride.Gen8.CacheControl = MO_WT;
            // L3 is not included because WT vs UC vs WB only effects uncore
            else if(!(pCachePolicy[Usage].LLC || pCachePolicy[Usage].ELLC))
                pCachePolicy[Usage].MemoryObjectOverride.Gen8.CacheControl = MO_UC;

            else
                pCachePolicy[Usage].MemoryObjectOverride.Gen8.CacheControl = MO_WB;


            if(!GetUsagePTEValue(pCachePolicy[Usage], Usage, &PTEValue))
            {
                CachePolicyError = true;
            }
            // On error, the PTE value is set to a UC PAT entry
            pCachePolicy[Usage].PTE.DwordValue     = PTEValue & 0xFFFFFFFF;
            pCachePolicy[Usage].PTE.HighDwordValue = 0;
	    pCachePolicy[Usage].Override       = ALWAYS_OVERRIDE;

            if(CachePolicyError)
            {
                GMM_ASSERTDPF("Cache Policy Init Error: Invalid Cache Programming - Element %d", Usage);
            }
        }
    }

    return GMM_SUCCESS;
}